

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * lest::not_expr(text *__return_storage_ptr__,text *message)

{
  size_type sVar1;
  long *plVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong local_40;
  long lStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"! ( ",message);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_40 = *puVar4;
    lStack_38 = plVar2[3];
    puVar3 = &local_40;
  }
  else {
    local_40 = *puVar4;
    puVar3 = (ulong *)*plVar2;
  }
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (puVar3 == &local_40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_38;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_40 = local_40 & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text not_expr( text message )
{
    return "! ( " + message + " )";
}